

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  cpp_dec_float<200U,_int,_void> *v;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  pointer pnVar4;
  long lVar5;
  type_conflict5 tVar6;
  undefined8 *puVar7;
  DataKey DVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  devexpr *pdVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  long lVar17;
  byte bVar18;
  int local_304;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2b8.m_backend.fpclass = cpp_dec_float_finite;
  local_2b8.m_backend.prec_elem = 0x1c;
  local_2b8.m_backend.data._M_elems[0] = 0;
  local_2b8.m_backend.data._M_elems[1] = 0;
  local_2b8.m_backend.data._M_elems[2] = 0;
  local_2b8.m_backend.data._M_elems[3] = 0;
  local_2b8.m_backend.data._M_elems[4] = 0;
  local_2b8.m_backend.data._M_elems[5] = 0;
  local_2b8.m_backend.data._M_elems[6] = 0;
  local_2b8.m_backend.data._M_elems[7] = 0;
  local_2b8.m_backend.data._M_elems[8] = 0;
  local_2b8.m_backend.data._M_elems[9] = 0;
  local_2b8.m_backend.data._M_elems[10] = 0;
  local_2b8.m_backend.data._M_elems[0xb] = 0;
  local_2b8.m_backend.data._M_elems[0xc] = 0;
  local_2b8.m_backend.data._M_elems[0xd] = 0;
  local_2b8.m_backend.data._M_elems[0xe] = 0;
  local_2b8.m_backend.data._M_elems[0xf] = 0;
  local_2b8.m_backend.data._M_elems[0x10] = 0;
  local_2b8.m_backend.data._M_elems[0x11] = 0;
  local_2b8.m_backend.data._M_elems[0x12] = 0;
  local_2b8.m_backend.data._M_elems[0x13] = 0;
  local_2b8.m_backend.data._M_elems[0x14] = 0;
  local_2b8.m_backend.data._M_elems[0x15] = 0;
  local_2b8.m_backend.data._M_elems[0x16] = 0;
  local_2b8.m_backend.data._M_elems[0x17] = 0;
  local_2b8.m_backend.data._M_elems[0x18] = 0;
  local_2b8.m_backend.data._M_elems[0x19] = 0;
  local_2b8.m_backend.data._M_elems._104_5_ = 0;
  local_2b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_2b8.m_backend.exp = 0;
  local_2b8.m_backend.neg = false;
  lVar17 = (long)start;
  lVar11 = lVar17 << 7;
  local_304 = -1;
  lVar5 = 0x1c;
  while( true ) {
    if ((int)((ulong)((long)pnVar4 - (long)pnVar3) >> 7) <= lVar17) break;
    puVar7 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar11 + 0x78);
    lVar10 = 0x1c;
    puVar12 = (uint *)(puVar7 + -0xf);
    pnVar14 = &local_2b8;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = *puVar12;
      puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_2b8.m_backend.exp = *(int *)(puVar7 + -1);
    local_2b8.m_backend.neg = *(bool *)((long)puVar7 + -4);
    local_2b8.m_backend._120_8_ = *puVar7;
    pnVar14 = feastol;
    pnVar16 = &result;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar6 = boost::multiprecision::operator<(&local_2b8,&result);
    if (tVar6) {
      pnVar14 = &local_2b8;
      pdVar15 = local_b0;
      for (lVar10 = lVar5; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(uint *)pdVar15 = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pdVar15 = pdVar15 + (ulong)bVar18 * -8 + 4;
      }
      local_40 = local_2b8.m_backend.exp;
      local_3c = local_2b8.m_backend.neg;
      local_38 = local_2b8.m_backend.fpclass;
      iStack_34 = local_2b8.m_backend.prec_elem;
      v = (cpp_dec_float<200U,_int,_void> *)((long)&(pnVar3->m_backend).data + lVar11);
      pcVar13 = v;
      pnVar14 = &local_130;
      for (lVar10 = lVar5; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar18 * -8 + 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar11 + 0x70);
      local_130.m_backend.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar11 + 0x74);
      local_130.m_backend._120_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar11 + 0x78)
      ;
      pnVar14 = feastol;
      pnVar16 = &local_1b0;
      for (lVar10 = lVar5; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (feastol->m_backend).exp;
      local_1b0.m_backend.neg = (feastol->m_backend).neg;
      local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_b0,&local_130,&local_1b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      pnVar14 = &result;
      pnVar16 = &local_2b8;
      for (lVar10 = lVar5; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_2b8.m_backend.exp = result.m_backend.exp;
      local_2b8.m_backend.neg = result.m_backend.neg;
      local_2b8.m_backend.fpclass = result.m_backend.fpclass;
      local_2b8.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar6 = boost::multiprecision::operator>(&local_2b8,best);
      if (tVar6) {
        pnVar14 = &local_2b8;
        pnVar16 = best;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        (best->m_backend).exp = local_2b8.m_backend.exp;
        (best->m_backend).neg = local_2b8.m_backend.neg;
        (best->m_backend).fpclass = local_2b8.m_backend.fpclass;
        (best->m_backend).prec_elem = local_2b8.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(this->last).m_backend,v);
        local_304 = (int)lVar17;
      }
    }
    lVar17 = lVar17 + incr;
    lVar11 = lVar11 + (long)incr * 0x80;
  }
  if (local_304 < 0) {
    DVar8.info = 0;
    DVar8.idx = -1;
  }
  else {
    DVar8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,local_304);
  }
  return (SPxId)DVar8;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseDim(R& best, R feastol, int start, int incr)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   int end = this->thesolver->coWeights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->coTest().dim());

   for(; start < end; start += incr)
   {
      x = cTest[start];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = cpen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);

   return SPxId();
}